

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::DrawBuffersIndexedTest::init
          (DrawBuffersIndexedTest *this,EVP_PKEY_CTX *ctx)

{
  bool *pbVar1;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar2;
  SeparateBlendEq SVar3;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar4;
  BlendFunc *pBVar5;
  Vector<bool,_4> *pVVar6;
  BlendState post;
  bool bVar7;
  ContextType ctxType;
  undefined7 extraout_var;
  NotSupportedError *this_00;
  undefined7 extraout_var_00;
  int i;
  long lVar9;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 *puVar10;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  BlendState *pre;
  BlendState *pBVar11;
  char in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffff99;
  anon_union_8_2_d0736028_for_Maybe<bool>_2 in_stack_ffffffffffffffa0;
  BlendEq in_stack_ffffffffffffffa8;
  BlendEq in_stack_ffffffffffffffac;
  undefined8 uVar12;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  undefined8 in_stack_ffffffffffffffc0;
  BlendFunc in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uVar13;
  undefined1 local_20 [8];
  int iVar8;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(ctxType,(ApiType)0x23);
  iVar8 = (int)CONCAT71(extraout_var,bVar7);
  if (!bVar7) {
    puVar10 = (undefined1 *)0x0;
    pbVar1 = (this->m_postCommonBlendState).enableBlend.m_ptr;
    if (pbVar1 != (bool *)0x0) {
      puVar10 = &stack0xffffffffffffff88;
      in_stack_ffffffffffffff88 = *pbVar1;
    }
    pre = (BlendState *)0x0;
    pEVar2 = (this->m_postCommonBlendState).blendEq.m_ptr;
    if (pEVar2 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                   *)0x0) {
      pre = (BlendState *)&stack0xffffffffffffff98;
      in_stack_ffffffffffffff98 = pEVar2->m_isFirst;
      in_stack_ffffffffffffffa0.m_align = (deUint64)&stack0xffffffffffffffa8;
      if ((bool)in_stack_ffffffffffffff98 == true) {
        in_stack_ffffffffffffffa8 = ((pEVar2->field_1).m_second)->rgb;
      }
      else {
        SVar3 = *(pEVar2->field_1).m_second;
        in_stack_ffffffffffffffa8 = SVar3.rgb;
        in_stack_ffffffffffffffac = SVar3.alpha;
      }
    }
    uVar12 = (undefined1 *)0x0;
    pEVar4 = (this->m_postCommonBlendState).blendFunc.m_ptr;
    if (pEVar4 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) {
      uVar12 = &stack0xffffffffffffffb8;
      in_stack_ffffffffffffffb8 = pEVar4->m_isFirst;
      in_stack_ffffffffffffffc0 = &stack0xffffffffffffffc8;
      pBVar5 = (pEVar4->field_1).m_first;
      if ((bool)in_stack_ffffffffffffffb8 == true) {
        in_stack_ffffffffffffffc8 = *pBVar5;
      }
      else {
        in_stack_ffffffffffffffc8 = *pBVar5;
        in_stack_ffffffffffffffd0 = pBVar5[1];
      }
    }
    uVar13 = 0;
    pVVar6 = (this->m_postCommonBlendState).colorMask.m_ptr;
    if (pVVar6 != (Vector<bool,_4> *)0x0) {
      uVar13 = local_20;
      lVar9 = 0;
      do {
        local_20[lVar9] = pVVar6->m_data[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    post.enableBlend.field_1.m_align = (deUint64)puVar10;
    post.enableBlend.m_ptr = (bool *)in_stack_ffffffffffffff78;
    post.blendEq.m_ptr._0_1_ = in_stack_ffffffffffffff88;
    post.blendEq.m_ptr._1_7_ = in_stack_ffffffffffffff89;
    post.blendEq.field_1.m_align = (deUint64)pre;
    post.blendEq.field_1.m_data[8] = in_stack_ffffffffffffff98;
    post.blendEq.field_1._9_7_ = in_stack_ffffffffffffff99;
    post.blendEq.field_1._16_8_ = in_stack_ffffffffffffffa0.m_align;
    post.blendFunc.m_ptr._0_4_ = in_stack_ffffffffffffffa8;
    post.blendFunc.m_ptr._4_4_ = in_stack_ffffffffffffffac;
    post.blendFunc.field_1.m_align = uVar12;
    post.blendFunc.field_1.m_data[8] = in_stack_ffffffffffffffb8;
    post.blendFunc.field_1._9_7_ = in_stack_ffffffffffffffb9;
    post.blendFunc.field_1._16_8_ = in_stack_ffffffffffffffc0;
    post.blendFunc.field_1._24_4_ = in_stack_ffffffffffffffc8.src;
    post.blendFunc.field_1._28_4_ = in_stack_ffffffffffffffc8.dst;
    post.colorMask.m_ptr = (Vector<bool,_4> *)in_stack_ffffffffffffffd0;
    post.colorMask.field_1.m_align = uVar13;
    pBVar11 = pre;
    uVar13 = uVar12;
    bVar7 = requiresAdvancedBlendEq
                      ((anon_unknown_0 *)(this->m_preCommonBlendState).blendEq.m_ptr,pre,post,
                       (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                        *)(this->m_drawBuffers).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    if (bVar7) {
      bVar7 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_KHR_blend_equation_advanced");
      if ((undefined1 *)uVar13 != (undefined1 *)0x0) {
        *(undefined1 *)uVar13 = 1;
        *(undefined8 *)(uVar13 + 8) = 0;
      }
      if (pBVar11 != (BlendState *)0x0) {
        *(undefined1 *)&(pBVar11->enableBlend).m_ptr = 1;
        (pBVar11->enableBlend).field_1.m_align = 0;
      }
      if (!bVar7) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_00,"Extension GL_KHR_blend_equation_advanced not supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                   ,0x4ae);
        goto LAB_01663711;
      }
    }
    else {
      if ((undefined1 *)uVar12 != (undefined1 *)0x0) {
        *(undefined1 *)uVar12 = 1;
        *(undefined8 *)(uVar12 + 8) = 0;
        pre = pBVar11;
      }
      if (pre != (BlendState *)0x0) {
        *(undefined1 *)&(pre->enableBlend).m_ptr = 1;
        (pre->enableBlend).field_1.m_align = 0;
      }
    }
    bVar7 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_draw_buffers_indexed");
    iVar8 = (int)CONCAT71(extraout_var_00,bVar7);
    if (!bVar7) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Extension GL_EXT_draw_buffers_indexed not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                 ,0x4b1);
LAB_01663711:
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return iVar8;
}

Assistant:

void DrawBuffersIndexedTest::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32)
	{
		if (requiresAdvancedBlendEq(m_preCommonBlendState, m_postCommonBlendState, m_drawBuffers) && !m_context.getContextInfo().isExtensionSupported("GL_KHR_blend_equation_advanced"))
			TCU_THROW(NotSupportedError, "Extension GL_KHR_blend_equation_advanced not supported");

		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_draw_buffers_indexed"))
			TCU_THROW(NotSupportedError, "Extension GL_EXT_draw_buffers_indexed not supported");
	}
}